

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O2

void __thiscall HighsOptionsStruct::HighsOptionsStruct(HighsOptionsStruct *this)

{
  allocator local_63;
  allocator local_62;
  allocator local_61;
  allocator local_60;
  allocator local_5f;
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  this->_vptr_HighsOptionsStruct = (_func_int **)&PTR__HighsOptionsStruct_004329c8;
  std::__cxx11::string::string((string *)&this->presolve,"",&local_59);
  local_38 = &this->presolve;
  std::__cxx11::string::string((string *)&this->solver,"",&local_5a);
  local_40 = &this->solver;
  std::__cxx11::string::string((string *)&this->parallel,"",&local_5b);
  local_48 = &this->parallel;
  std::__cxx11::string::string((string *)&this->run_crossover,"",&local_5c);
  this->time_limit = 0.0;
  local_50 = &this->run_crossover;
  std::__cxx11::string::string((string *)&this->solution_file,"",&local_5d);
  local_58 = &this->solution_file;
  std::__cxx11::string::string((string *)&this->write_model_file,"",&local_5e);
  this->random_seed = 0;
  std::__cxx11::string::string((string *)&this->ranging,"",&local_5f);
  memset(&this->infinite_cost,0,0x90);
  std::__cxx11::string::string((string *)&this->log_file,"",&local_60);
  this->write_model_to_file = false;
  this->write_presolved_model_to_file = false;
  this->write_solution_to_file = false;
  this->write_solution_style = 0;
  this->glpsol_cost_row_location = 0;
  std::__cxx11::string::string((string *)&this->write_presolved_model_file,"",&local_61);
  this->output_flag = false;
  this->log_to_console = false;
  this->timeless_log = false;
  this->ipm_iteration_limit = 0;
  this->pdlp_native_termination = false;
  this->pdlp_scaling = false;
  this->pdlp_iteration_limit = 0;
  this->pdlp_e_restart_method = 0;
  this->pdlp_d_gap_tol = 0.0;
  this->qp_iteration_limit = 0;
  this->qp_nullspace_limit = 0;
  *(undefined8 *)((long)&this->qp_nullspace_limit + 1) = 0;
  this->log_dev_level = 0;
  this->log_githash = false;
  this->solve_relaxation = false;
  this->allow_unbounded_or_infeasible = false;
  this->use_implied_bounds_from_presolve = false;
  this->lp_presolve_requires_basis_postsolve = false;
  this->mps_parser_type_free = false;
  this->use_warm_start = true;
  this->keep_n_rows = 0;
  this->cost_scale_factor = 0;
  this->allowed_matrix_scale_factor = 0;
  this->allowed_cost_scale_factor = 0;
  this->ipx_dualize_strategy = 0;
  this->simplex_dualize_strategy = 0;
  this->simplex_permute_strategy = 0;
  this->max_dual_simplex_cleanup_level = 0;
  this->max_dual_simplex_phase1_cleanup_level = 0;
  this->simplex_price_strategy = 0;
  this->simplex_unscaled_solution_strategy = 0;
  this->presolve_reduction_limit = 0;
  this->restart_presolve_reduction_limit = 0;
  this->presolve_substitution_maxfillin = 0;
  this->presolve_rule_off = 0;
  this->presolve_rule_logging = false;
  this->presolve_remove_slacks = false;
  this->simplex_initial_condition_check = false;
  this->no_unnecessary_rebuild_refactor = false;
  *(undefined8 *)&this->use_original_HFactor_logic = 0;
  *(undefined8 *)((long)&this->centring_ratio_tolerance + 2) = 0;
  this->start_crossover_tolerance = 0.0;
  this->less_infeasible_DSE_check = false;
  this->less_infeasible_DSE_choose_row = false;
  this->use_original_HFactor_logic = false;
  this->run_centring = false;
  this->max_centring_steps = 0;
  this->factor_pivot_threshold = 0.0;
  this->factor_pivot_tolerance = 0.0;
  this->dual_simplex_pivot_growth_tolerance = 0.0;
  this->presolve_pivot_threshold = 0.0;
  this->dual_simplex_cost_perturbation_multiplier = 0.0;
  this->primal_simplex_bound_perturbation_multiplier = 0.0;
  this->dual_steepest_edge_weight_error_tolerance = 0.0;
  this->dual_steepest_edge_weight_log_error_threshold = 0.0;
  this->simplex_initial_condition_tolerance = 0.0;
  this->rebuild_refactor_solution_error_tolerance = 0.0;
  std::__cxx11::string::string((string *)&this->icrash_strategy,"",&local_62);
  *(undefined8 *)((long)&this->mip_heuristic_effort + 2) = 0;
  *(undefined8 *)((long)&this->mip_min_logging_interval + 2) = 0;
  this->mip_abs_gap = 0.0;
  this->mip_heuristic_effort = 0.0;
  this->mip_feasibility_tolerance = 0.0;
  this->mip_rel_gap = 0.0;
  this->mip_pool_soft_limit = 0;
  this->mip_pscost_minreliable = 0;
  this->mip_min_cliquetable_entries_for_parallelism = 0;
  this->mip_report_level = 0;
  this->mip_max_leaves = 0;
  this->mip_max_improving_sols = 0;
  this->mip_lp_age_limit = 0;
  this->mip_pool_age_limit = 0;
  this->icrash_exact = false;
  this->icrash_breakpoints = false;
  this->mip_detect_symmetry = false;
  this->mip_allow_restart = false;
  this->mip_max_nodes = 0;
  this->mip_max_stall_nodes = 0;
  this->mip_max_start_nodes = 0;
  this->icrash_starting_weight = 0.0;
  this->icrash_iterations = 0;
  this->icrash_approx_iter = 0;
  std::__cxx11::string::string((string *)&this->mip_improving_solution_file,"",&local_63);
  this->mip_root_presolve_only = false;
  this->mip_lifting_for_probing = -1;
  (this->log_options).log_stream = (FILE *)0x0;
  (this->log_options).output_flag = (bool *)0x0;
  (this->log_options).log_to_console = (bool *)0x0;
  (this->log_options).log_dev_level = (HighsInt *)0x0;
  (this->log_options).user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  (this->log_options).user_log_callback_data = (void *)0x0;
  *(undefined8 *)&(this->log_options).user_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->log_options).user_callback.super__Function_base._M_functor + 8) = 0;
  (this->log_options).user_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->log_options).user_callback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)((long)&(this->log_options).user_callback._M_invoker + 1) = 0;
  *(undefined8 *)((long)&(this->log_options).user_callback_data + 1) = 0;
  return;
}

Assistant:

HighsOptionsStruct()
      : presolve(""),
        solver(""),
        parallel(""),
        run_crossover(""),
        time_limit(0.0),
        solution_file(""),
        write_model_file(""),
        random_seed(0),
        ranging(""),
        infinite_cost(0.0),
        infinite_bound(0.0),
        small_matrix_value(0.0),
        large_matrix_value(0.0),
        primal_feasibility_tolerance(0.0),
        dual_feasibility_tolerance(0.0),
        ipm_optimality_tolerance(0.0),
        primal_residual_tolerance(0.0),
        dual_residual_tolerance(0.0),
        objective_bound(0.0),
        objective_target(0.0),
        threads(0),
        user_bound_scale(0),
        user_cost_scale(0),
        highs_debug_level(0),
        highs_analysis_level(0),
        simplex_strategy(0),
        simplex_scale_strategy(0),
        simplex_crash_strategy(0),
        simplex_dual_edge_weight_strategy(0),
        simplex_primal_edge_weight_strategy(0),
        simplex_iteration_limit(0),
        simplex_update_limit(0),
        simplex_min_concurrency(0),
        simplex_max_concurrency(0),
        log_file(""),
        write_model_to_file(false),
        write_presolved_model_to_file(false),
        write_solution_to_file(false),
        write_solution_style(0),
        glpsol_cost_row_location(0),
        write_presolved_model_file(""),
        output_flag(false),
        log_to_console(false),
        timeless_log(false),
        ipm_iteration_limit(0),
        pdlp_native_termination(false),
        pdlp_scaling(false),
        pdlp_iteration_limit(0),
        pdlp_e_restart_method(0),
        pdlp_d_gap_tol(0.0),
        qp_iteration_limit(0),
        qp_nullspace_limit(0),
        iis_strategy(0),
        blend_multi_objectives(false),
        log_dev_level(0),
        log_githash(false),
        solve_relaxation(false),
        allow_unbounded_or_infeasible(false),
        use_implied_bounds_from_presolve(false),
        lp_presolve_requires_basis_postsolve(false),
        mps_parser_type_free(false),
        use_warm_start(true),
        keep_n_rows(0),
        cost_scale_factor(0),
        allowed_matrix_scale_factor(0),
        allowed_cost_scale_factor(0),
        ipx_dualize_strategy(0),
        simplex_dualize_strategy(0),
        simplex_permute_strategy(0),
        max_dual_simplex_cleanup_level(0),
        max_dual_simplex_phase1_cleanup_level(0),
        simplex_price_strategy(0),
        simplex_unscaled_solution_strategy(0),
        presolve_reduction_limit(0),
        restart_presolve_reduction_limit(0),
        presolve_substitution_maxfillin(0),
        presolve_rule_off(0),
        presolve_rule_logging(false),
        presolve_remove_slacks(false),
        simplex_initial_condition_check(false),
        no_unnecessary_rebuild_refactor(false),
        simplex_initial_condition_tolerance(0.0),
        rebuild_refactor_solution_error_tolerance(0.0),
        dual_steepest_edge_weight_error_tolerance(0.0),
        dual_steepest_edge_weight_log_error_threshold(0.0),
        dual_simplex_cost_perturbation_multiplier(0.0),
        primal_simplex_bound_perturbation_multiplier(0.0),
        dual_simplex_pivot_growth_tolerance(0.0),
        presolve_pivot_threshold(0.0),
        factor_pivot_threshold(0.0),
        factor_pivot_tolerance(0.0),
        start_crossover_tolerance(0.0),
        less_infeasible_DSE_check(false),
        less_infeasible_DSE_choose_row(false),
        use_original_HFactor_logic(false),
        run_centring(false),
        max_centring_steps(0),
        centring_ratio_tolerance(0.0),
        icrash(false),
        icrash_dualize(false),
        icrash_strategy(""),
        icrash_starting_weight(0.0),
        icrash_iterations(0),
        icrash_approx_iter(0),
        icrash_exact(false),
        icrash_breakpoints(false),
        mip_detect_symmetry(false),
        mip_allow_restart(false),
        mip_max_nodes(0),
        mip_max_stall_nodes(0),
        mip_max_start_nodes(0),
        mip_max_leaves(0),
        mip_max_improving_sols(0),
        mip_lp_age_limit(0),
        mip_pool_age_limit(0),
        mip_pool_soft_limit(0),
        mip_pscost_minreliable(0),
        mip_min_cliquetable_entries_for_parallelism(0),
        mip_report_level(0),
        mip_feasibility_tolerance(0.0),
        mip_rel_gap(0.0),
        mip_abs_gap(0.0),
        mip_heuristic_effort(0.0),
        mip_min_logging_interval(0.0),
#ifdef HIGHS_DEBUGSOL
        mip_debug_solution_file(""),
#endif
        mip_improving_solution_save(false),
        mip_improving_solution_report_sparse(false),
        // clang-format off
        mip_improving_solution_file(""),
        mip_root_presolve_only(false),
        mip_lifting_for_probing(-1) {}